

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RangeReader.h
# Opt level: O0

ssize_t __thiscall RangeReader::write(RangeReader *this,int __fd,void *__buf,size_t __n)

{
  unsigned_long *puVar1;
  undefined8 *puVar2;
  element_type *peVar3;
  undefined4 in_register_00000034;
  unsigned_long local_38;
  void *local_30;
  ulong local_28;
  size_t want;
  size_t n_local;
  uint8_t *p_local;
  RangeReader *this_local;
  
  n_local = CONCAT44(in_register_00000034,__fd);
  local_38 = this->_endofs - this->_curpos;
  local_30 = __buf;
  want = (size_t)__buf;
  p_local = (uint8_t *)this;
  puVar1 = std::min<unsigned_long>((unsigned_long *)&local_30,&local_38);
  local_28 = *puVar1;
  if (local_28 < want) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "write beyond limit";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->_r);
  (*peVar3->_vptr_ReadWriter[3])(peVar3,n_local,local_28);
  this->_curpos = local_28 + this->_curpos;
  return (ssize_t)this;
}

Assistant:

virtual void write(const uint8_t *p, size_t n)
    {
        size_t want= (size_t)std::min(uint64_t(n), _endofs-_curpos);
        if (want<n)
            throw "write beyond limit";
        _r->write(p, want);
        _curpos += want;
    }